

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O2

int tlv_interest_get_header
              (uint8_t *interest,size_t buflen,interest_options_t *options,uint8_t **name,
              size_t *name_len)

{
  uint8_t *puVar1;
  uint32_t *buf;
  uint64_t uVar2;
  int iVar3;
  uint32_t local_38;
  uint local_34;
  uint32_t real_type;
  uint32_t real_len;
  
  puVar1 = tlv_get_type_length(interest,buflen,&local_38,&local_34);
  iVar3 = -0xe;
  if (puVar1 != (uint8_t *)0x0) {
    if (local_38 == 5) {
      if (interest + (buflen - (long)puVar1) == (uint8_t *)(ulong)local_34) {
        *name = puVar1;
        puVar1 = tlv_get_type_length(puVar1,(size_t)(ulong)local_34,&local_38,&local_34);
        if (puVar1 != (uint8_t *)0x0) {
          if (local_38 == 7) {
            *name_len = (ulong)local_34;
            if (options != (interest_options_t *)0x0) {
              options->must_be_fresh = false;
              options->lifetime = 4000;
              options->hop_limit = '\0';
              options->can_be_prefix = false;
              options->nonce = 0;
              puVar1 = puVar1 + local_34;
              while (puVar1 < interest + buflen) {
                buf = (uint32_t *)
                      tlv_get_type_length(puVar1,(long)(interest + buflen) - (long)puVar1,&local_38,
                                          &local_34);
                if (buf == (uint32_t *)0x0) {
                  return -0xe;
                }
                if (local_38 == 0x12) {
                  options->must_be_fresh = true;
                }
                else if (local_38 == 0x21) {
                  options->can_be_prefix = true;
                }
                else if (local_34 == 1 && local_38 == 0x22) {
                  options->hop_limit = (uint8_t)*buf;
                }
                else if (local_34 == 4 && local_38 == 10) {
                  options->nonce = *buf;
                }
                else if (local_38 == 0xc) {
                  uVar2 = tlv_get_uint((uint8_t *)buf,(ulong)local_34);
                  options->lifetime = uVar2;
                }
                puVar1 = (uint8_t *)((long)buf + (ulong)local_34);
              }
            }
            iVar3 = 0;
          }
          else {
            iVar3 = -0x11;
          }
        }
      }
      else {
        iVar3 = -0xd;
      }
    }
    else {
      iVar3 = -0xc;
    }
  }
  return iVar3;
}

Assistant:

int
tlv_interest_get_header(uint8_t* interest,
                        size_t buflen,
                        interest_options_t* options,
                        uint8_t** name,
                        size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(interest, buflen, &real_type, &real_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (real_type != TLV_Interest) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (real_len != buflen - (ptr - interest)) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;
  ptr += real_len;

  // Options
  if(options == NULL){
    return NDN_SUCCESS;
  }
  options->can_be_prefix = false;
  options->must_be_fresh = false;
  options->lifetime = NDN_DEFAULT_INTEREST_LIFETIME;
  options->hop_limit = 0;
  options->nonce = 0;
  while (ptr < interest + buflen) {
    ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
    if(ptr == NULL){
      return NDN_OVERSIZE_VAR;
    }
    if (real_type == TLV_CanBePrefix) {
      options->can_be_prefix = true;
    }
    else if (real_type == TLV_MustBeFresh) {
      options->must_be_fresh = true;
    }
    else if (real_type == TLV_HopLimit && real_len == sizeof(options->hop_limit)) {
      options->hop_limit = *ptr;
    }
    else if (real_type == TLV_Nonce && real_len == sizeof(options->nonce)) {
      memcpy(&options->nonce, ptr, sizeof(options->nonce));
    }
    else if (real_type == TLV_InterestLifetime) {
      options->lifetime = tlv_get_uint(ptr, real_len);
    }
    ptr += real_len;
  }
  return NDN_SUCCESS;
}